

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O3

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::UnChain
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *pBuf,charcount_t bufLen)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Data *pDVar5;
  Data **ppDVar6;
  Data *src;
  uint uVar7;
  charcount_t *pcVar8;
  
  uVar7 = this->count;
  uVar3 = uVar7;
  if (this->secondChunk == (Data *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe0,"(this->IsChained())","this->IsChained()");
    if (!bVar2) goto LAB_00758bf7;
    *puVar4 = 0;
    uVar3 = this->count;
  }
  if (bufLen < uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe2,"(bufLen >= this->count)","bufLen >= this->count");
    if (!bVar2) {
LAB_00758bf7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  src = this->firstChunk;
  pDVar5 = this->lastChunk;
  if (src != pDVar5) {
    ppDVar6 = &this->secondChunk;
    pcVar8 = &this->firstChunkLength;
    do {
      uVar3 = *pcVar8;
      if (bufLen < uVar3) goto LAB_00758bed;
      pcVar8 = (charcount_t *)*ppDVar6;
      js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)src,(ulong)uVar3);
      bufLen = bufLen - uVar3;
      pBuf = pBuf + uVar3;
      uVar7 = uVar7 - uVar3;
      src = (Data *)(pcVar8 + 4);
      ppDVar6 = (Data **)(pcVar8 + 2);
      pDVar5 = this->lastChunk;
    } while ((Data *)pcVar8 != pDVar5);
  }
  if (uVar7 <= bufLen) {
    js_wmemcpy_s(pBuf,(ulong)bufLen,(char16 *)(pDVar5 + 1),(ulong)uVar7);
    return;
  }
LAB_00758bed:
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void UnChain(__out __ecount(bufLen) char16 *pBuf, charcount_t bufLen)
        {
            charcount_t lastChunkCount = this->count;

            Assert(this->IsChained());

            Assert(bufLen >= this->count);
            char16 *pSrcBuf = this->firstChunk->u.single.buffer;
            Data *next = this->secondChunk;
            charcount_t srcLength = this->firstChunkLength;

            for (Data *chunk = this->firstChunk; chunk != this->lastChunk; next = chunk->u.chained.next)
            {
                if (bufLen < srcLength)
                {
                    Throw::FatalInternalError();
                }
                js_wmemcpy_s(pBuf, bufLen, pSrcBuf, srcLength);
                bufLen -= srcLength;
                pBuf += srcLength;
                lastChunkCount -= srcLength;

                chunk = next;
                pSrcBuf = chunk->u.chained.buffer;
                srcLength = chunk->u.chained.length;
            }

            if (bufLen < lastChunkCount)
            {
                Throw::FatalInternalError();
            }
            js_wmemcpy_s(pBuf, bufLen, this->lastChunk->u.chained.buffer, lastChunkCount);
        }